

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.h
# Opt level: O3

void skipNextN(uint64_t *seed,uint64_t n)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint64_t k;
  long lVar5;
  
  lVar2 = 1;
  if (n == 0) {
    lVar3 = 0;
  }
  else {
    lVar4 = 0x5deece66d;
    lVar5 = 0xb;
    lVar3 = 0;
    do {
      if ((n & 1) != 0) {
        lVar2 = lVar2 * lVar4;
        lVar3 = lVar3 * lVar4 + lVar5;
      }
      lVar5 = lVar5 * (lVar4 + 1);
      lVar4 = lVar4 * lVar4;
      bVar1 = 1 < n;
      n = n >> 1;
    } while (bVar1);
  }
  *seed = lVar2 * *seed + lVar3 & 0xffffffffffff;
  return;
}

Assistant:

static inline void skipNextN(uint64_t *seed, uint64_t n)
{
    uint64_t m = 1;
    uint64_t a = 0;
    uint64_t im = 0x5deece66dULL;
    uint64_t ia = 0xb;
    uint64_t k;

    for (k = n; k; k >>= 1)
    {
        if (k & 1)
        {
            m *= im;
            a = im * a + ia;
        }
        ia = (im + 1) * ia;
        im *= im;
    }

    *seed = *seed * m + a;
    *seed &= 0xffffffffffffULL;
}